

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprIsInteger(Expr *p,int *pValue)

{
  char cVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  Expr *in_RSI;
  char *in_RDI;
  int v;
  int rc;
  uint in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = 0;
  if (in_RDI == (char *)0x0) {
    local_4 = 0;
  }
  else if ((*(uint *)(in_RDI + 4) & 0x400) == 0) {
    if (*in_RDI == -0x5f) {
      iVar4 = sqlite3ExprIsInteger(in_RSI,(int *)(ulong)in_stack_ffffffffffffffe0);
      if (iVar4 != 0) {
        *(uint *)in_RSI = -in_stack_ffffffffffffffe0;
        local_4 = 1;
      }
    }
    else if (*in_RDI == -0x5e) {
      local_4 = sqlite3ExprIsInteger(in_RSI,(int *)(ulong)in_stack_ffffffffffffffe0);
    }
  }
  else {
    cVar1 = in_RDI[9];
    cVar2 = in_RDI[10];
    cVar3 = in_RDI[0xb];
    in_RSI->op = in_RDI[8];
    in_RSI->affinity = cVar1;
    in_RSI->field_0x2 = cVar2;
    in_RSI->field_0x3 = cVar3;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprIsInteger(Expr *p, int *pValue){
  int rc = 0;
  if( p==0 ) return 0;  /* Can only happen following on OOM */

  /* If an expression is an integer literal that fits in a signed 32-bit
  ** integer, then the EP_IntValue flag will have already been set */
  assert( p->op!=TK_INTEGER || (p->flags & EP_IntValue)!=0
           || sqlite3GetInt32(p->u.zToken, &rc)==0 );

  if( p->flags & EP_IntValue ){
    *pValue = p->u.iValue;
    return 1;
  }
  switch( p->op ){
    case TK_UPLUS: {
      rc = sqlite3ExprIsInteger(p->pLeft, pValue);
      break;
    }
    case TK_UMINUS: {
      int v;
      if( sqlite3ExprIsInteger(p->pLeft, &v) ){
        assert( v!=(-2147483647-1) );
        *pValue = -v;
        rc = 1;
      }
      break;
    }
    default: break;
  }
  return rc;
}